

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O0

void sf::priv::ensureExtensionsInit(Display *display,int screen)

{
  undefined4 in_ESI;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  if (!ensureExtensionsInit::initialized) {
    ensureExtensionsInit::initialized = true;
    sfglx_LoadFunctions((Display *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                        in_stack_ffffffffffffffec);
  }
  return;
}

Assistant:

void ensureExtensionsInit(::Display* display, int screen)
{
    static bool initialized = false;
    if (!initialized)
    {
        initialized = true;

        // We don't check the return value since the extension
        // flags are cleared even if loading fails
        sfglx_LoadFunctions(display, screen);
    }
}